

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O2

void __thiscall WebServer::cachePage(WebServer *this,string *filename)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  int iVar1;
  void *__addr;
  mapped_type *this_00;
  undefined1 local_f8 [8];
  stat fileStat;
  string path;
  
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&path.field_2 + 8);
  std::operator+(__return_storage_ptr__,&HttpConn::root_abi_cxx11_,"/..");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (fileStat.__glibc_reserved + 2),__return_storage_ptr__,filename);
  std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
  iVar1 = stat((char *)fileStat.__glibc_reserved[2],(stat *)local_f8);
  if ((-1 < iVar1) &&
     (((uint)fileStat.st_nlink & 0xf000) != 0x4000 && ((uint)fileStat.st_nlink & 4) != 0)) {
    iVar1 = open((char *)fileStat.__glibc_reserved[2],0);
    __addr = mmap((void *)0x0,fileStat.st_rdev,1,2,iVar1,0);
    close(iVar1);
    if (__addr == (void *)0xffffffffffffffff) {
      __addr = (void *)0xffffffffffffffff;
    }
    else {
      path.field_2._8_8_ = &stack0xffffffffffffffc8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&path.field_2 + 8),__addr,(long)__addr + fileStat.st_rdev);
      this_00 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&HttpConn::cache__abi_cxx11_,filename);
      std::__cxx11::string::operator=((string *)this_00,(string *)(path.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
    }
    munmap(__addr,fileStat.st_rdev);
  }
  std::__cxx11::string::~string((string *)(fileStat.__glibc_reserved + 2));
  return;
}

Assistant:

void WebServer::cachePage(const std::string& filename) {
    struct stat fileStat;
    std::string path = HttpConn::root + "/.." + filename; 
    if (stat(path.c_str(), &fileStat) < 0) {
        return;
    }
    if (!(fileStat.st_mode & S_IROTH)) {
        return;
    }
    if (S_ISDIR(fileStat.st_mode)) {
        return;
    }
    int fd = open(path.c_str(), O_RDONLY);
    void* mmapAddr = mmap(0, fileStat.st_size, PROT_READ, MAP_PRIVATE, fd, 0);
    ::close(fd);
    if (mmapAddr == (void*)-1) {
        munmap(mmapAddr, fileStat.st_size);
        return;
    }

    char* file = static_cast<char*>(mmapAddr); 
    HttpConn::cache_[filename] = std::string(file, file + fileStat.st_size);
    munmap(mmapAddr, fileStat.st_size);
}